

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ListeningReporter::benchmarkStarting(ListeningReporter *this,BenchmarkInfo *benchmarkInfo)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter> *listener;
  pointer puVar3;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_listeners).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = puVar3->m_ptr;
    if (pIVar2 == (IStreamingReporter *)0x0) goto LAB_0015d538;
    (*pIVar2->_vptr_IStreamingReporter[9])(pIVar2,benchmarkInfo);
  }
  pIVar2 = (this->m_reporter).m_ptr;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*pIVar2->_vptr_IStreamingReporter[9])(pIVar2,benchmarkInfo);
    return;
  }
LAB_0015d538:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x4b8,
                "T *Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator->() const [T = Catch::IStreamingReporter]"
               );
}

Assistant:

void ListeningReporter::benchmarkStarting(BenchmarkInfo const &benchmarkInfo) {
        for (auto const &listener : m_listeners) {
            listener->benchmarkStarting(benchmarkInfo);
        }
        m_reporter->benchmarkStarting(benchmarkInfo);
    }